

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O0

void __thiscall libtorrent::aux::file_entry::file_entry(file_entry *this,file_entry *fe)

{
  file_entry *fe_local;
  file_entry *this_local;
  
  *(ulong *)this = *(ulong *)this & 0xffff000000000000 | *(ulong *)fe & 0xffffffffffff;
  *(ulong *)this = *(ulong *)this & 0x8000ffffffffffff | (*(ulong *)fe >> 0x30 & 0x7fff) << 0x30;
  *(ulong *)this = *(ulong *)this & 0x7fffffffffffffff | *(ulong *)fe & 0x8000000000000000;
  *(ulong *)&this->field_0x8 =
       *(ulong *)&this->field_0x8 & 0xffff000000000000 | *(ulong *)&fe->field_0x8 & 0xffffffffffff;
  *(ulong *)&this->field_0x8 =
       *(ulong *)&this->field_0x8 & 0xf000ffffffffffff |
       (*(ulong *)&fe->field_0x8 >> 0x30 & 0xfff) << 0x30;
  *(ulong *)&this->field_0x8 =
       *(ulong *)&this->field_0x8 & 0xefffffffffffffff |
       (*(ulong *)&fe->field_0x8 >> 0x3c & 1) << 0x3c;
  *(ulong *)&this->field_0x8 =
       *(ulong *)&this->field_0x8 & 0xdfffffffffffffff |
       (*(ulong *)&fe->field_0x8 >> 0x3d & 1) << 0x3d;
  *(ulong *)&this->field_0x8 =
       *(ulong *)&this->field_0x8 & 0xbfffffffffffffff |
       (*(ulong *)&fe->field_0x8 >> 0x3e & 1) << 0x3e;
  *(ulong *)&this->field_0x8 =
       *(ulong *)&this->field_0x8 & 0x7fffffffffffffff |
       *(ulong *)&fe->field_0x8 & 0x8000000000000000;
  this->name = fe->name;
  this->root = fe->root;
  (this->path_index).m_val = (fe->path_index).m_val;
  *(ulong *)&fe->field_0x8 = *(ulong *)&fe->field_0x8 & 0xf000ffffffffffff;
  fe->name = (char *)0x0;
  return;
}

Assistant:

file_entry::file_entry(file_entry&& fe) noexcept
		: offset(fe.offset)
		, symlink_index(fe.symlink_index)
		, no_root_dir(fe.no_root_dir)
		, size(fe.size)
		, name_len(fe.name_len)
		, pad_file(fe.pad_file)
		, hidden_attribute(fe.hidden_attribute)
		, executable_attribute(fe.executable_attribute)
		, symlink_attribute(fe.symlink_attribute)
		, name(fe.name)
		, root(fe.root)
		, path_index(fe.path_index)
	{
		fe.name_len = 0;
		fe.name = nullptr;
	}